

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O2

void __thiscall gmath::SMatrix<double,_3,_3>::SMatrix(SMatrix<double,_3,_3> *this)

{
  int k;
  long lVar1;
  double (*padVar2) [3];
  int i;
  long lVar3;
  
  padVar2 = (double (*) [3])this;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      (*(double (*) [3])*padVar2)[lVar3] = 0.0;
    }
    padVar2 = padVar2 + 1;
  }
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x20) {
    *(undefined8 *)((long)this->v[0] + lVar1) = 0x3ff0000000000000;
  }
  return;
}

Assistant:

SMatrix()
    {
      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          v[k][i]=0;
        }

      int n=nrows;

      if (ncols < nrows)
      {
        n=ncols;
      }

      for (int i=0; i<n; i++)
      {
        v[i][i]=1;
      }
    }